

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_linklist_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  _Bool _Var10;
  _Bool _Var11;
  _Bool _Var12;
  _Bool _Var13;
  _Bool _Var14;
  _Bool _Var15;
  _Bool _Var16;
  _Bool _Var17;
  _Bool _Var18;
  _Bool _Var19;
  _Bool _Var20;
  _Bool _Var21;
  _Bool _Var22;
  _Bool _Var23;
  _Bool _Var24;
  _Bool _Var25;
  _Bool _Var26;
  _Bool _Var27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  undefined1 local_60 [8];
  uo_linklist link3;
  uo_linklist link2;
  uo_linklist link1;
  uo_linklist head;
  _Bool passed;
  char **argv_local;
  int argc_local;
  
  uo__linklist_selflink((uo_linklist *)&link1.prev);
  uo__linklist_reset((uo_linklist *)&link2.prev);
  uo__linklist_reset((uo_linklist *)&link3.prev);
  uo__linklist_reset((uo_linklist *)local_60);
  _Var1 = uo__linklist_is_empty((uo_linklist *)&link1.prev);
  _Var2 = uo__linklist_is_linked((uo_linklist *)&link2.prev);
  _Var3 = uo__linklist_is_linked((uo_linklist *)&link2.prev);
  _Var4 = uo__linklist_is_linked((uo_linklist *)local_60);
  uo__linklist_link((uo_linklist *)&link1.prev,(uo_linklist *)&link2.prev);
  _Var5 = uo__linklist_is_empty((uo_linklist *)&link1.prev);
  bVar28 = link1.prev == (uo_linklist *)&link2.prev;
  bVar29 = link2.prev == (uo_linklist *)&link1.prev;
  bVar30 = link1.next == (uo_linklist *)&link1.prev;
  uo__linklist_link((uo_linklist *)&link1.prev,(uo_linklist *)&link3.prev);
  bVar31 = link1.prev == (uo_linklist *)&link2.prev;
  bVar32 = link2.prev == (uo_linklist *)&link3.prev;
  bVar33 = link1.next == (uo_linklist *)&link1.prev;
  bVar34 = link3.prev == (uo_linklist *)&link1.prev;
  bVar35 = link2.next == (uo_linklist *)&link2.prev;
  uo__linklist_link((uo_linklist *)&link1.prev,(uo_linklist *)local_60);
  bVar36 = link1.prev == (uo_linklist *)&link2.prev;
  bVar37 = link2.prev == (uo_linklist *)&link3.prev;
  bVar38 = link1.next == (uo_linklist *)&link1.prev;
  bVar39 = link3.prev == (uo_linklist *)local_60;
  bVar40 = link2.next == (uo_linklist *)&link2.prev;
  bVar41 = local_60 == (undefined1  [8])&link1.prev;
  bVar42 = link3.next == (uo_linklist *)&link3.prev;
  uo__linklist_unlink((uo_linklist *)local_60);
  bVar43 = link1.prev == (uo_linklist *)&link2.prev;
  bVar44 = link2.prev == (uo_linklist *)&link3.prev;
  bVar45 = link1.next == (uo_linklist *)&link1.prev;
  bVar46 = link3.prev == (uo_linklist *)&link1.prev;
  bVar47 = link2.next == (uo_linklist *)&link2.prev;
  _Var6 = uo__linklist_is_linked((uo_linklist *)local_60);
  uo__linklist_unlink((uo_linklist *)&link3.prev);
  bVar48 = link1.prev == (uo_linklist *)&link2.prev;
  bVar49 = link2.prev == (uo_linklist *)&link1.prev;
  bVar50 = link1.next == (uo_linklist *)&link1.prev;
  _Var7 = uo__linklist_is_linked((uo_linklist *)&link3.prev);
  _Var8 = uo__linklist_is_linked((uo_linklist *)local_60);
  uo__linklist_unlink((uo_linklist *)&link2.prev);
  _Var9 = uo__linklist_is_empty((uo_linklist *)&link1.prev);
  _Var10 = uo__linklist_is_linked((uo_linklist *)&link2.prev);
  _Var11 = uo__linklist_is_linked((uo_linklist *)&link3.prev);
  _Var12 = uo__linklist_is_linked((uo_linklist *)local_60);
  uo__linklist_unlink((uo_linklist *)&link1.prev);
  _Var13 = uo__linklist_is_linked((uo_linklist *)&link1.prev);
  _Var14 = uo__linklist_is_linked((uo_linklist *)&link2.prev);
  _Var15 = uo__linklist_is_linked((uo_linklist *)&link3.prev);
  _Var16 = uo__linklist_is_linked((uo_linklist *)local_60);
  uo__linklist_selflink((uo_linklist *)&link1.prev);
  uo__linklist_link((uo_linklist *)&link1.prev,(uo_linklist *)&link2.prev);
  uo__linklist_link((uo_linklist *)&link2.prev,(uo_linklist *)&link3.prev);
  uo__linklist_link((uo_linklist *)&link3.prev,(uo_linklist *)local_60);
  bVar51 = link1.prev == (uo_linklist *)local_60;
  bVar52 = link1.next == (uo_linklist *)&link3.prev;
  bVar53 = link2.prev == (uo_linklist *)&link1.prev;
  bVar54 = link2.next == (uo_linklist *)local_60;
  bVar55 = link3.prev == (uo_linklist *)&link2.prev;
  uo__linklist_unlink((uo_linklist *)local_60);
  bVar56 = link1.prev == (uo_linklist *)&link3.prev;
  bVar57 = link1.next == (uo_linklist *)&link3.prev;
  bVar58 = link2.prev == (uo_linklist *)&link1.prev;
  _Var17 = uo__linklist_is_linked((uo_linklist *)local_60);
  uo__linklist_unlink((uo_linklist *)&link3.prev);
  _Var18 = uo__linklist_is_linked((uo_linklist *)&link3.prev);
  _Var19 = uo__linklist_is_linked((uo_linklist *)local_60);
  uo__linklist_unlink((uo_linklist *)&link2.prev);
  _Var20 = uo__linklist_is_empty((uo_linklist *)&link1.prev);
  _Var21 = uo__linklist_is_linked((uo_linklist *)&link2.prev);
  _Var22 = uo__linklist_is_linked((uo_linklist *)&link3.prev);
  _Var23 = uo__linklist_is_linked((uo_linklist *)local_60);
  uo__linklist_unlink((uo_linklist *)&link1.prev);
  _Var24 = uo__linklist_is_linked((uo_linklist *)&link1.prev);
  _Var25 = uo__linklist_is_linked((uo_linklist *)&link2.prev);
  _Var26 = uo__linklist_is_linked((uo_linklist *)&link3.prev);
  _Var27 = uo__linklist_is_linked((uo_linklist *)local_60);
  return (uint)(((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((_Var1 & (
                                                  _Var2 ^ 0xffU) & 1) != 0 & (_Var3 ^ 0xffU) & 1) !=
                                                  0 & (_Var4 ^ 0xffU) & 1) != 0 &
                                                  (_Var5 ^ 0xffU) & 1) != 0 && bVar28) &&
                                                  head.next == (uo_linklist *)&link2.prev) && bVar29
                                                  ) && bVar30) && bVar31) &&
                                                  head.next == (uo_linklist *)&link3.prev) && bVar32
                                                  ) && bVar33) && bVar34) && bVar35) && bVar36) &&
                                                  head.next == (uo_linklist *)local_60) && bVar37)
                                                  && bVar38) && bVar39) && bVar40) && bVar41) &&
                                                  bVar42) && bVar43) &&
                                                  head.next == (uo_linklist *)&link3.prev) && bVar44
                                                  ) && bVar45) && bVar46) && bVar47) &
                                                  (_Var6 ^ 0xffU) & 1) != 0 && bVar48) &&
                                                  head.next == (uo_linklist *)&link2.prev) && bVar49
                                                  ) && bVar50) & (_Var7 ^ 0xffU) & 1) != 0 &
                                                  (_Var8 ^ 0xffU) & 1) != 0 && _Var9) &
                                                  (_Var10 ^ 0xffU) & 1) != 0 & (_Var11 ^ 0xffU) & 1)
                                                  != 0 & (_Var12 ^ 0xffU) & 1) != 0 &
                                                (_Var13 ^ 0xffU) & 1) != 0 & (_Var14 ^ 0xffU) & 1)
                                               != 0 & (_Var15 ^ 0xffU) & 1) != 0 &
                                             (_Var16 ^ 0xffU) & 1) != 0 &&
                                            head.next == (uo_linklist *)&link2.prev) && bVar51) &&
                                          bVar52) && bVar53) && bVar54) && bVar55) &&
                                      link3.next == (uo_linklist *)&link1.prev) &&
                                     local_60 == (undefined1  [8])&link3.prev) &&
                                    head.next == (uo_linklist *)&link2.prev) && bVar56) && bVar57)
                                 && bVar58) && link2.next == (uo_linklist *)&link1.prev) &&
                               link3.prev == (uo_linklist *)&link2.prev) & (_Var17 ^ 0xffU) & 1) !=
                              0 && head.next == (uo_linklist *)&link2.prev) &&
                            link1.prev == (uo_linklist *)&link2.prev) &&
                           link1.next == (uo_linklist *)&link1.prev) &&
                          link2.prev == (uo_linklist *)&link1.prev) & (_Var18 ^ 0xffU) & 1) != 0 &
                        (_Var19 ^ 0xffU) & 1) != 0 && _Var20) & (_Var21 ^ 0xffU) & 1) != 0 &
                     (_Var22 ^ 0xffU) & 1) != 0 & (_Var23 ^ 0xffU) & 1) != 0 & (_Var24 ^ 0xffU) & 1)
                   != 0 & (_Var25 ^ 0xffU) & 1) != 0 & (_Var26 ^ 0xffU) & 1) != 0 &
                (_Var27 ^ 0xffU) & 1) == 0);
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    uo_linklist head;
    uo_linklist link1;
    uo_linklist link2;
    uo_linklist link3;

    uo_linklist_selflink(&head);
    uo_linklist_reset(&link1);
    uo_linklist_reset(&link2);
    uo_linklist_reset(&link3);

    passed &= uo_linklist_is_empty(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_link(&head, &link1);
    passed &= !uo_linklist_is_empty(&head);
    passed &= head.next == &link1;
    passed &= head.prev == &link1;
    passed &= link1.next == &head;
    passed &= link1.prev == &head;

    uo_linklist_link(&head, &link2);
    passed &= head.next == &link1;
    passed &= head.prev == &link2;
    passed &= link1.next == &link2;
    passed &= link1.prev == &head;
    passed &= link2.next == &head;
    passed &= link2.prev == &link1;

    uo_linklist_link(&head, &link3);
    passed &= head.next == &link1;
    passed &= head.prev == &link3;
    passed &= link1.next == &link2;
    passed &= link1.prev == &head;
    passed &= link2.next == &link3;
    passed &= link2.prev == &link1;
    passed &= link3.next == &head;
    passed &= link3.prev == &link2;

    uo_linklist_unlink(&link3);
    passed &= head.next == &link1;
    passed &= head.prev == &link2;
    passed &= link1.next == &link2;
    passed &= link1.prev == &head;
    passed &= link2.next == &head;
    passed &= link2.prev == &link1;
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link2);
    passed &= head.next == &link1;
    passed &= head.prev == &link1;
    passed &= link1.next == &head;
    passed &= link1.prev == &head;
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link1);
    passed &= uo_linklist_is_empty(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&head);
    passed &= !uo_linklist_is_linked(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_selflink(&head);
    uo_linklist_link(&head, &link1);
    uo_linklist_link(&link1, &link2);
    uo_linklist_link(&link2, &link3);
    passed &= head.prev == &link1;
    passed &= head.next == &link3;
    passed &= link1.prev == &link2;
    passed &= link1.next == &head;
    passed &= link2.prev == &link3;
    passed &= link2.next == &link1;
    passed &= link3.prev == &head;
    passed &= link3.next == &link2;

    uo_linklist_unlink(&link3);
    passed &= head.prev == &link1;
    passed &= head.next == &link2;
    passed &= link1.prev == &link2;
    passed &= link1.next == &head;
    passed &= link2.prev == &head;
    passed &= link2.next == &link1;
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link2);
    passed &= head.prev == &link1;
    passed &= head.next == &link1;
    passed &= link1.prev == &head;
    passed &= link1.next == &head;
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link1);
    passed &= uo_linklist_is_empty(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&head);
    passed &= !uo_linklist_is_linked(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    return passed ? 0 : 1;
}